

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

FB * __thiscall
amrex::FabArrayBase::getFB
          (FabArrayBase *this,IntVect *nghost,Periodicity *period,bool cross,
          bool enforce_periodicity_only,bool override_sync)

{
  Long *pLVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  IndexType IVar4;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_> _Var5;
  FB *pFVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>_>
  pVar7;
  IntVect IVar8;
  pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*> local_48;
  
  pVar7 = std::
          _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>_>
          ::equal_range((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>_>
                         *)m_TheFBCache,&this->m_bdkey);
  _Var5 = pVar7.first._M_node;
  do {
    if (_Var5._M_node == (_Base_ptr)pVar7.second._M_node) {
      pFVar6 = (FB *)operator_new(0x60);
      FB::FB(pFVar6,this,nghost,cross,period,enforce_periodicity_only,override_sync,
             this->m_multi_ghost);
      pFVar6->m_nuse = 1;
      CacheStats::recordBuild((CacheStats *)m_FBC_stats);
      m_FBC_stats._16_8_ = m_FBC_stats._16_8_ + 1;
      local_48.first.m_ba_id.data = (this->m_bdkey).m_ba_id.data;
      local_48.first.m_dm_id.data = (this->m_bdkey).m_dm_id.data;
      local_48.second = pFVar6;
      std::
      _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>>>
      ::_M_insert_equal_<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>>
                ((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>>>
                  *)m_TheFBCache,(_Base_ptr)pVar7.second._M_node,&local_48);
      return pFVar6;
    }
    p_Var2 = _Var5._M_node[1]._M_left;
    IVar4 = BATransformer::index_type(&(this->boxarray).m_bat);
    if (IVar4.itype == p_Var2[1]._M_color) {
      p_Var2 = _Var5._M_node[1]._M_left;
      IVar8 = BATransformer::coarsen_ratio(&(this->boxarray).m_bat);
      if ((((((*(int *)&p_Var2[1].field_0x4 == IVar8.vect[0]) &&
             (*(int *)&p_Var2[1]._M_parent == IVar8.vect[1])) &&
            (*(int *)((long)&p_Var2[1]._M_parent + 4) == IVar8.vect[2])) &&
           ((p_Var2 = _Var5._M_node[1]._M_left, *(int *)&p_Var2[1]._M_left == nghost->vect[0] &&
            (*(int *)((long)&p_Var2[1]._M_left + 4) == nghost->vect[1])))) &&
          ((*(int *)&p_Var2[1]._M_right == nghost->vect[2] &&
           (((bool)*(char *)((long)&p_Var2[1]._M_right + 4) == cross &&
            ((bool)*(char *)&p_Var2[2]._M_right == this->m_multi_ghost)))))) &&
         (((bool)*(char *)((long)&p_Var2[1]._M_right + 5) == enforce_periodicity_only &&
          (((bool)*(char *)((long)&p_Var2[1]._M_right + 6) == override_sync &&
           (bVar3 = Periodicity::operator==((Periodicity *)(p_Var2 + 2),period), bVar3)))))) {
        pFVar6 = (FB *)_Var5._M_node[1]._M_left;
        pLVar1 = &pFVar6->m_nuse;
        *pLVar1 = *pLVar1 + 1;
        m_FBC_stats._16_8_ = m_FBC_stats._16_8_ + 1;
        return pFVar6;
      }
    }
    _Var5._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var5._M_node);
  } while( true );
}

Assistant:

const FabArrayBase::FB&
FabArrayBase::getFB (const IntVect& nghost, const Periodicity& period,
                     bool cross, bool enforce_periodicity_only,
                     bool override_sync) const
{
    BL_PROFILE("FabArrayBase::getFB()");

    BL_ASSERT(getBDKey() == m_bdkey);
    std::pair<FBCacheIter,FBCacheIter> er_it = m_TheFBCache.equal_range(m_bdkey);
    for (FBCacheIter it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_typ        == boxArray().ixType()      &&
            it->second->m_crse_ratio == boxArray().crseRatio()   &&
            it->second->m_ngrow      == nghost                   &&
            it->second->m_cross      == cross                    &&
            it->second->m_multi_ghost== m_multi_ghost            &&
            it->second->m_epo        == enforce_periodicity_only &&
            it->second->m_override_sync == override_sync         &&
            it->second->m_period     == period              )
        {
            ++(it->second->m_nuse);
            m_FBC_stats.recordUse();
            return *(it->second);
        }
    }

    // Have to build a new one
    FB* new_fb = new FB(*this, nghost, cross, period, enforce_periodicity_only,
                        override_sync, m_multi_ghost);

#ifdef AMREX_MEM_PROFILING
    m_FBC_stats.bytes += new_fb->bytes();
    m_FBC_stats.bytes_hwm = std::max(m_FBC_stats.bytes_hwm, m_FBC_stats.bytes);
#endif

    new_fb->m_nuse = 1;
    m_FBC_stats.recordBuild();
    m_FBC_stats.recordUse();

    m_TheFBCache.insert(er_it.second, FBCache::value_type(m_bdkey,new_fb));

    return *new_fb;
}